

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
TApp_RuntimeErrorInCallback_Test::~TApp_RuntimeErrorInCallback_Test
          (TApp_RuntimeErrorInCallback_Test *this)

{
  TApp_RuntimeErrorInCallback_Test *this_local;
  
  ~TApp_RuntimeErrorInCallback_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RuntimeErrorInCallback) {
    auto sub1 = app.add_subcommand("sub1");
    sub1->set_callback([]() { throw CLI::RuntimeError(); });
    auto sub2 = app.add_subcommand("sub2");
    sub2->set_callback([]() { throw CLI::RuntimeError(2); });

    args = {"sub1"};
    EXPECT_THROW(run(), CLI::RuntimeError);

    app.reset();
    args = {"sub1"};
    try {
        run();
    } catch(const CLI::RuntimeError &e) {
        EXPECT_EQ(1, e.get_exit_code());
    }

    app.reset();
    args = {"sub2"};
    EXPECT_THROW(run(), CLI::RuntimeError);

    app.reset();
    args = {"sub2"};
    try {
        run();
    } catch(const CLI::RuntimeError &e) {
        EXPECT_EQ(2, e.get_exit_code());
    }
}